

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void AddStringToLexer(Lexer *lexer,ctmbstr str)

{
  for (; *str != 0; str = (ctmbstr)((byte *)str + 1)) {
    prvTidyAddCharToLexer(lexer,(uint)(byte)*str);
  }
  return;
}

Assistant:

static void AddStringToLexer( Lexer *lexer, ctmbstr str )
{
    uint c;

    /*  Many (all?) compilers will sign-extend signed chars (the default) when
    **  converting them to unsigned integer values.  We must cast our char to
    **  unsigned char before assigning it to prevent this from happening.
    */
    while( 0 != (c = (unsigned char) *str++ ))
        TY_(AddCharToLexer)( lexer, c );
}